

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O2

int lib::base::DoPairs(State *state)

{
  bool bVar1;
  int iVar2;
  Table *this;
  Value *key_00;
  Value value;
  Value key;
  StackAPI api;
  
  luna::StackAPI::StackAPI(&api,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>(&api,2,ValueT_Table);
  iVar2 = 0;
  if (bVar1) {
    this = luna::StackAPI::GetTable(&api,0);
    key_00 = luna::StackAPI::GetValue(&api,1);
    key.field_0.obj_ = (GCObject *)0x0;
    key.type_ = ValueT_Nil;
    value.field_0.obj_ = (GCObject *)0x0;
    value.type_ = ValueT_Nil;
    if (key_00->type_ == ValueT_Nil) {
      luna::Table::FirstKeyValue(this,&key,&value);
    }
    else {
      luna::Table::NextKeyValue(this,key_00,&key,&value);
    }
    luna::StackAPI::PushValue(&api,&key);
    luna::StackAPI::PushValue(&api,&value);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int DoPairs(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(2, luna::ValueT_Table))
            return 0;

        luna::Table *t = api.GetTable(0);
        luna::Value *last_key = api.GetValue(1);

        luna::Value key;
        luna::Value value;
        if (last_key->type_ == luna::ValueT_Nil)
            t->FirstKeyValue(key, value);
        else
            t->NextKeyValue(*last_key, key, value);

        api.PushValue(key);
        api.PushValue(value);
        return 2;
    }